

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void unixShmBarrier(sqlite3_file *fd)

{
  sqlite3_mutex *psVar1;
  
  if (sqlite3Config.bCoreMutex != 0) {
    psVar1 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar1);
    }
    if (sqlite3Config.bCoreMutex != 0) {
      psVar1 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar1);
        return;
      }
    }
  }
  return;
}

Assistant:

static void unixShmBarrier(
  sqlite3_file *fd                /* Database file holding the shared memory */
){
  UNUSED_PARAMETER(fd);
  unixEnterMutex();
  unixLeaveMutex();
}